

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicy.cpp
# Opt level: O3

GMM_STATUS __thiscall GmmLib::GmmGen12dGPUCachePolicy::SetupPAT(GmmGen12dGPUCachePolicy *this)

{
  Context *pCVar1;
  ulong uVar2;
  
  pCVar1 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pGmmLibContext;
  if ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.NumPATRegisters
      != 0) {
    uVar2 = 0;
    do {
      pCVar1->PrivatePATTable[uVar2].Value = 0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                     super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                     super_GmmCachePolicyCommon.NumPATRegisters);
  }
  pCVar1->PrivatePATTable[0] = (GMM_PRIVATE_PAT)0x0;
  pCVar1->PrivatePATTable[1] = (GMM_PRIVATE_PAT)0x1;
  pCVar1->PrivatePATTable[2] = (GMM_PRIVATE_PAT)0x2;
  pCVar1->PrivatePATTable[3] = (GMM_PRIVATE_PAT)0x3;
  pCVar1->PrivatePATTable[4] = (GMM_PRIVATE_PAT)0x6;
  pCVar1->PrivatePATTable[5] = (GMM_PRIVATE_PAT)0x7;
  pCVar1->PrivatePATTable[6] = (GMM_PRIVATE_PAT)0xa;
  pCVar1->PrivatePATTable[7] = (GMM_PRIVATE_PAT)0xb;
  *(undefined4 *)&(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.field_0x2c = 7;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmGen12dGPUCachePolicy::SetupPAT()
{
    GMM_PRIVATE_PAT *pPATTlbElement = &(pGmmLibContext->GetPrivatePATTable()[0]);

#define L3_UC (0x0)
#define L3_WC (0x1)
#define L3_WT (0x2)
#define L3_WB (0x3)

#define GMM_DEFINE_PAT_ELEMENT(indx, CLOS, L3Caching)       \
    {                                                       \
        pPATTlbElement[indx].Xe_HPC.MemoryType = L3Caching; \
        pPATTlbElement[indx].Xe_HPC.L3CLOS     = CLOS;      \
        pPATTlbElement[indx].Xe_HPC.Reserved   = 0;         \
    }

    // clang-format off

    // Default PAT Table
    for (uint32_t i = 0; i < NumPATRegisters; i++)
    {   //                      Index      CLOS       CachingPolicy
        GMM_DEFINE_PAT_ELEMENT( i,          0              , L3_UC );
    }

    // Fixed PAT Table
    // Group: CLOS0
    //                      Index CLOS          CachingPolicy
    GMM_DEFINE_PAT_ELEMENT( 0    , 0              , L3_UC )    // PATRegValue = 0x0
     GMM_DEFINE_PAT_ELEMENT( 1    , 0              , L3_WC )    // PATRegValue = 0x1
    GMM_DEFINE_PAT_ELEMENT( 2    , 0              , L3_WT )    // PATRegValue = 0x2
    GMM_DEFINE_PAT_ELEMENT( 3    , 0              , L3_WB )    // PATRegValue = 0x3
    //Group: CLOS1
    GMM_DEFINE_PAT_ELEMENT( 4    , 1              , L3_WT )    // PATRegValue = 0x6
    GMM_DEFINE_PAT_ELEMENT( 5    , 1              , L3_WB )    // PATRegValue = 0x7
    //Group: CLOS2
    GMM_DEFINE_PAT_ELEMENT( 6    , 2              , L3_WT )    // PATRegValue = 0xA
    GMM_DEFINE_PAT_ELEMENT( 7    , 2              , L3_WB )    // PATRegValue = 0xB

    CurrentMaxPATIndex = 7;

// clang-format on
#undef GMM_DEFINE_PAT_ELEMENT
#undef L3_UC
#undef L3_WC
#undef L3_WT
#undef L3_WB
    return GMM_SUCCESS;
}